

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_iso9660.c
# Opt level: O0

int archive_read_format_iso9660_cleanup(archive_read *a)

{
  iso9660 *iso9660_00;
  int iVar1;
  int local_1c;
  int r;
  iso9660 *iso9660;
  archive_read *a_local;
  
  local_1c = 0;
  iso9660_00 = (iso9660 *)a->format->data;
  release_files(iso9660_00);
  free((iso9660_00->read_ce_req).reqs);
  archive_string_free(&iso9660_00->pathname);
  archive_string_free(&iso9660_00->previous_pathname);
  free((iso9660_00->pending_files).files);
  free((iso9660_00->entry_zisofs).uncompressed_buffer);
  free((iso9660_00->entry_zisofs).block_pointers);
  if (((iso9660_00->entry_zisofs).stream_valid != 0) &&
     (iVar1 = cm_zlib_inflateEnd(&(iso9660_00->entry_zisofs).stream), iVar1 != 0)) {
    archive_set_error(&a->archive,-1,"Failed to clean up zlib decompressor");
    local_1c = -0x1e;
  }
  free(iso9660_00->utf16be_path);
  free(iso9660_00->utf16be_previous_path);
  free(iso9660_00);
  a->format->data = (void *)0x0;
  return local_1c;
}

Assistant:

static int
archive_read_format_iso9660_cleanup(struct archive_read *a)
{
	struct iso9660 *iso9660;
	int r = ARCHIVE_OK;

	iso9660 = (struct iso9660 *)(a->format->data);
	release_files(iso9660);
	free(iso9660->read_ce_req.reqs);
	archive_string_free(&iso9660->pathname);
	archive_string_free(&iso9660->previous_pathname);
	free(iso9660->pending_files.files);
#ifdef HAVE_ZLIB_H
	free(iso9660->entry_zisofs.uncompressed_buffer);
	free(iso9660->entry_zisofs.block_pointers);
	if (iso9660->entry_zisofs.stream_valid) {
		if (inflateEnd(&iso9660->entry_zisofs.stream) != Z_OK) {
			archive_set_error(&a->archive, ARCHIVE_ERRNO_MISC,
			    "Failed to clean up zlib decompressor");
			r = ARCHIVE_FATAL;
		}
	}
#endif
	free(iso9660->utf16be_path);
	free(iso9660->utf16be_previous_path);
	free(iso9660);
	(a->format->data) = NULL;
	return (r);
}